

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
PlayerInfoIRCCommand::trigger
          (PlayerInfoIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char *__s;
  size_type __len2;
  string *psVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  Server *pSVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  string *psVar11;
  char *pcVar12;
  Server *pSVar13;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  long local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  IRC_Bot *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  pcVar12 = nick._M_str;
  sVar8 = nick._M_len;
  pcVar9 = channel._M_str;
  sVar10 = channel._M_len;
  lVar4 = Jupiter::IRC::Client::getChannel(source,sVar10,pcVar9);
  if (lVar4 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    local_58 = source;
    iVar3 = Jupiter::IRC::Client::getAccessLevel(source,sVar10,pcVar9,sVar8,pcVar12);
    psVar11 = &pluginInstance.m_playerInfoFormat;
    psVar1 = &pluginInstance.m_playerInfoFormat;
    if (1 < iVar3) {
      psVar11 = &pluginInstance.m_adminPlayerInfoFormat;
      psVar1 = &pluginInstance.m_adminPlayerInfoFormat;
    }
    __s = (psVar11->_M_dataplus)._M_p;
    __len2 = psVar1->_M_string_length;
    local_50 = sVar8;
    local_48 = pcVar12;
    local_40 = sVar10;
    local_38 = pcVar9;
    if (parameters._M_len == 0) {
      local_88 = 0;
      while( true ) {
        RenX::getCore();
        lVar4 = RenX::Core::getServerCount();
        if (local_88 == lVar4) break;
        uVar6 = RenX::getCore();
        pSVar7 = (Server *)RenX::Core::getServer(uVar6);
        cVar2 = RenX::Server::isLogChanType((int)pSVar7);
        local_88 = local_88 + 1;
        if ((cVar2 != '\0') && (*(long *)(pSVar7 + 0x20) != 0)) {
          pSVar13 = pSVar7 + 0x10;
          while (pSVar13 = *(Server **)pSVar13, pcVar12 = local_48, sVar8 = local_50,
                pSVar13 != pSVar7 + 0x10) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&local_78,0,local_78._M_string_length,__s,__len2);
            RenX::processTags((string *)&local_78,pSVar7,(PlayerInfo *)(pSVar13 + 0x10),
                              (PlayerInfo *)0x0,(BuildingInfo *)0x0);
            Jupiter::IRC::Client::sendMessage
                      (local_58,local_40,local_38,local_78._M_string_length,
                       local_78._M_dataplus._M_p);
          }
        }
      }
    }
    else {
      lVar4 = 0;
      while( true ) {
        RenX::getCore();
        lVar5 = RenX::Core::getServerCount();
        pcVar12 = local_48;
        sVar8 = local_50;
        if (lVar4 == lVar5) break;
        uVar6 = RenX::getCore();
        pSVar7 = (Server *)RenX::Core::getServer(uVar6);
        cVar2 = RenX::Server::isLogChanType((int)pSVar7);
        lVar4 = lVar4 + 1;
        if ((cVar2 != '\0') && (*(long *)(pSVar7 + 0x20) != 0)) {
          for (pSVar13 = *(Server **)(pSVar7 + 0x10); pSVar13 != pSVar7 + 0x10;
              pSVar13 = *(Server **)pSVar13) {
            in_string._M_str = *(char **)(pSVar13 + 0x18);
            in_string._M_len = *(size_t *)(pSVar13 + 0x20);
            sVar8 = jessilib::find<char,char,false>(in_string,parameters);
            if (sVar8 != 0xffffffffffffffff) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&local_78,0,local_78._M_string_length,__s,__len2);
              RenX::processTags((string *)&local_78,pSVar7,(PlayerInfo *)(pSVar13 + 0x10),
                                (PlayerInfo *)0x0,(BuildingInfo *)0x0);
              Jupiter::IRC::Client::sendMessage
                        (local_58,local_40,local_38,local_78._M_string_length,
                         local_78._M_dataplus._M_p);
            }
          }
        }
      }
    }
    if (local_78._M_string_length == 0) {
      Jupiter::IRC::Client::sendNotice(local_58,sVar8,pcVar12,0x18,"Error: Player not found.");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void PlayerInfoIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr) {
		int type = chan->getType();
		std::string msg;
		RenX::Server *server;
		std::string_view player_info_format = source->getAccessLevel(channel, nick) > 1 ? pluginInstance.getAdminPlayerInfoFormat() : pluginInstance.getPlayerInfoFormat();
		size_t index = 0;

		if (parameters.empty()) { // List all players
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						msg = player_info_format;
						RenX::processTags(msg, server, &*node);
						source->sendMessage(channel, msg);
					}
				}
			}
		}
		else { // List all partial matches
			while (index != RenX::getCore()->getServerCount()) {
				server = RenX::getCore()->getServer(index++);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, std::string_view{parameters}) != std::string::npos) {
							msg = player_info_format;
							RenX::processTags(msg, server, &*node);
							source->sendMessage(channel, msg);
						}
					}
				}
			}
		}

		if (msg.empty()) {
			source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
}